

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O3

void __thiscall
AddressFactory_GetAddressByLockingScript_Test::TestBody
          (AddressFactory_GetAddressByLockingScript_Test *this)

{
  undefined1 *puVar1;
  bool bVar2;
  AssertHelperData *pAVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Script script;
  AddressFactory factory;
  Address address;
  AssertHelper local_3a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_3a0;
  undefined1 local_398 [16];
  AssertHelper local_388;
  _Alloc_hider local_380;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  void *local_348;
  void *local_330;
  void *local_318;
  code *local_300 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_288;
  Script local_270;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  Script local_200;
  AddressFactory local_1c8;
  Address local_1a0 [4];
  undefined4 local_19c;
  undefined1 *local_190;
  undefined1 local_180 [16];
  void *local_170;
  void *local_168;
  void *local_158;
  void *local_140;
  code *local_128 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b0;
  Script local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  cfd::AddressFactory::AddressFactory(&local_1c8);
  cfd::core::Script::Script(&local_200);
  cfd::core::Address::Address(local_1a0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac","");
  cfd::core::Script::Script((Script *)local_378,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_378);
      cfd::core::Address::operator=(local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_300);
      if (local_318 != (void *)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (void *)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (void *)0x0) {
        operator_delete(local_348);
      }
      if ((undefined1 *)local_368._0_8_ != local_378 + 0x20) {
        operator_delete((void *)local_368._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x219,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar4 = (long)local_168 - (long)local_170;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_168 - (long)local_170;
  }
  local_398._0_8_ = uVar4 + (long)pAVar3;
  local_3a8.data_ = pAVar3;
  if (local_168 != local_170) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_170,sVar6);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "49a011f97ba520dab063f309bad59daeb30de101");
  puVar1 = local_378 + 0x10;
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_380._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_19c;
  local_388.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",(char *)CONCAT71(local_378._1_7_,local_378[0])
             ,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_378);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"76a91449a011f97ba520dab063f309bad59daeb30de10188ac","");
  cfd::core::Script::Script((Script *)local_378,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_378);
      cfd::core::Address::operator=(local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_300);
      if (local_318 != (void *)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (void *)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (void *)0x0) {
        operator_delete(local_348);
      }
      if ((undefined1 *)local_368._0_8_ != local_378 + 0x20) {
        operator_delete((void *)local_368._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x21f,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar4 = (long)local_168 - (long)local_170;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_168 - (long)local_170;
  }
  local_398._0_8_ = uVar4 + (long)pAVar3;
  local_3a8.data_ = pAVar3;
  if (local_168 != local_170) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_170,sVar6);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"49a011f97ba520dab063f309bad59daeb30de101\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "49a011f97ba520dab063f309bad59daeb30de101");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_380._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x220,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_19c;
  local_388.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x221,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms\"",(char *)CONCAT71(local_378._1_7_,local_378[0])
             ,"17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_378);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x222,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487","");
  cfd::core::Script::Script((Script *)local_378,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_378);
      cfd::core::Address::operator=(local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_300);
      if (local_318 != (void *)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (void *)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (void *)0x0) {
        operator_delete(local_348);
      }
      if ((undefined1 *)local_368._0_8_ != local_378 + 0x20) {
        operator_delete((void *)local_368._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x225,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar4 = (long)local_168 - (long)local_170;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_168 - (long)local_170;
  }
  local_398._0_8_ = uVar4 + (long)pAVar3;
  local_3a8.data_ = pAVar3;
  if (local_168 != local_170) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_170,sVar6);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_380._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x226,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_19c;
  local_388.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2shAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x227,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw\"",(char *)CONCAT71(local_378._1_7_,local_378[0])
             ,"3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_378);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x228,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,"0014925d4028880bd0c9d68fbc7fc7dfee976698629c","");
  cfd::core::Script::Script((Script *)local_378,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_378);
      cfd::core::Address::operator=(local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_300);
      if (local_318 != (void *)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (void *)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (void *)0x0) {
        operator_delete(local_348);
      }
      if ((undefined1 *)local_368._0_8_ != local_378 + 0x20) {
        operator_delete((void *)local_368._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22b,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar4 = (long)local_168 - (long)local_170;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_168 - (long)local_170;
  }
  local_398._0_8_ = uVar4 + (long)pAVar3;
  local_3a8.data_ = pAVar3;
  if (local_168 != local_170) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_170,sVar6);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_380._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_19c;
  local_388.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2wpkhAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_378);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x22e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437","");
  cfd::core::Script::Script((Script *)local_378,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_378);
      cfd::core::Address::operator=(local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_300);
      if (local_318 != (void *)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (void *)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (void *)0x0) {
        operator_delete(local_348);
      }
      if ((undefined1 *)local_368._0_8_ != local_378 + 0x20) {
        operator_delete((void *)local_368._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x231,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar4 = (long)local_168 - (long)local_170;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_168 - (long)local_170;
  }
  local_398._0_8_ = uVar4 + (long)pAVar3;
  local_3a8.data_ = pAVar3;
  if (local_168 != local_170) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_170,sVar6);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_380._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x232,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_19c;
  local_388.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kP2wshAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x233,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_378);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x234,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb","");
  cfd::core::Script::Script((Script *)local_378,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_378);
      cfd::core::Address::operator=(local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_300);
      if (local_318 != (void *)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (void *)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (void *)0x0) {
        operator_delete(local_348);
      }
      if ((undefined1 *)local_368._0_8_ != local_378 + 0x20) {
        operator_delete((void *)local_368._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x237,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar4 = (long)local_168 - (long)local_170;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_168 - (long)local_170;
  }
  local_398._0_8_ = uVar4 + (long)pAVar3;
  local_3a8.data_ = pAVar3;
  if (local_168 != local_170) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_170,sVar6);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_380._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x238,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_19c;
  local_388.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x239,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_378);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_ = (AssertHelperData *)local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3a8,
             "512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799","");
  cfd::core::Script::Script((Script *)local_378,(string *)&local_3a8);
  cfd::core::Script::operator=(&local_200,(Script *)local_378);
  cfd::core::Script::~Script((Script *)local_378);
  if (local_3a8.data_ != (AssertHelperData *)local_398) {
    operator_delete(local_3a8.data_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::GetAddressByLockingScript((Script *)local_378);
      cfd::core::Address::operator=(local_1a0,(Address *)local_378);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_230);
      cfd::core::Script::~Script(&local_270);
      local_300[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_288);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_300);
      if (local_318 != (void *)0x0) {
        operator_delete(local_318);
      }
      if (local_330 != (void *)0x0) {
        operator_delete(local_330);
      }
      if (local_348 != (void *)0x0) {
        operator_delete(local_348);
      }
      if ((undefined1 *)local_368._0_8_ != local_378 + 0x20) {
        operator_delete((void *)local_368._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23d,
               "Expected: address = factory.GetAddressByLockingScript(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  local_3a8.data_ = (AssertHelperData *)0x0;
  sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_398._0_8_ = 0;
  uVar4 = (long)local_168 - (long)local_170;
  if (uVar4 == 0) {
    pAVar3 = (AssertHelperData *)0x0;
    sVar6 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar3 = (AssertHelperData *)operator_new(uVar4);
    sVar6 = (long)local_168 - (long)local_170;
  }
  local_398._0_8_ = uVar4 + (long)pAVar3;
  local_3a8.data_ = pAVar3;
  if (local_168 != local_170) {
    sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar3;
    memmove(pAVar3,local_170,sVar6);
  }
  sStack_3a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar3->type + sVar6);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_388,"address.GetHash().GetHex().c_str()",
             "\"88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_3a8.data_);
  }
  if (local_388.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_378);
    if (local_380._M_p == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_380._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_380,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.data_._0_4_ = local_19c;
  local_388.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_378,"address.GetAddressType()","AddressType::kTaprootAddress",
             (AddressType *)&local_3a8,(AddressType *)&local_388);
  if (local_378[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_378._8_8_ == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_378._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x23f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (local_3a8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_378 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3a8,"address.GetAddress().c_str()",
             "\"bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah\"",
             (char *)CONCAT71(local_378._1_7_,local_378[0]),
             "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
  if ((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]) != puVar1) {
    operator_delete((undefined1 *)CONCAT71(local_378._1_7_,local_378[0]));
  }
  if (local_3a8.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_378);
    if (sStack_3a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x240,pcVar5);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)local_378);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if (CONCAT71(local_378._1_7_,local_378[0]) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)CONCAT71(local_378._1_7_,local_378[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_378._1_7_,local_378[0]) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58);
  cfd::core::Script::~Script(&local_98);
  local_128[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_128);
  if (local_140 != (void *)0x0) {
    operator_delete(local_140);
  }
  if (local_158 != (void *)0x0) {
    operator_delete(local_158);
  }
  if (local_170 != (void *)0x0) {
    operator_delete(local_170);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  cfd::core::Script::~Script(&local_200);
  local_1c8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_1c8.prefix_list_);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByLockingScript)
{
  AddressFactory factory;
  Script script;
  Address address;

  script = Script("210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590cac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("76a91449a011f97ba520dab063f309bad59daeb30de10188ac");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "49a011f97ba520dab063f309bad59daeb30de101");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "17iJ5ssEuAcrD267chtACp6qLzVbPvwrms");

  script = Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2shAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "3Pj1y6dipvm7fjNc1sH6Q5KLPNvqWXWaEw");

  script = Script("0014925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "925d4028880bd0c9d68fbc7fc7dfee976698629c");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wpkhAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q");

  script = Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "87cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437");
  EXPECT_EQ(address.GetAddressType(), AddressType::kP2wshAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1qsl9shsrauk6malt4vkevv0a3dq00mzhhhkz68u8e3fff5hzs5smsz3fm4a");
  
  script = Script("51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4");
  
  script = Script("512088de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_NO_THROW(address = factory.GetAddressByLockingScript(script));
  EXPECT_STREQ(address.GetHash().GetHex().c_str(), "88de1a59b38939f58fb4f8c5ffc3d56390d43e9e91c7b1d67f91e070f3108799");
  EXPECT_EQ(address.GetAddressType(), AddressType::kTaprootAddress);
  EXPECT_STREQ(address.GetAddress().c_str(), "bc1p3r0p5kdn3yultra5lrzlls74vwgdg057j8rmr4nlj8s8pucss7vsftyvah");
}